

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

Own<kj::LocalPeerIdentity,_std::nullptr_t> __thiscall
kj::LocalPeerIdentity::newInstance(LocalPeerIdentity *this,Credentials *creds)

{
  LocalPeerIdentity *extraout_RDX;
  Own<kj::LocalPeerIdentity,_std::nullptr_t> OVar1;
  Credentials *local_18;
  Credentials *creds_local;
  
  local_18 = creds;
  creds_local = (Credentials *)this;
  heap<kj::(anonymous_namespace)::LocalPeerIdentityImpl,kj::LocalPeerIdentity::Credentials&>
            ((kj *)&stack0xffffffffffffffd8,creds);
  Own<kj::LocalPeerIdentity,decltype(nullptr)>::
  Own<kj::(anonymous_namespace)::LocalPeerIdentityImpl,void>
            ((Own<kj::LocalPeerIdentity,decltype(nullptr)> *)this,
             (Own<kj::(anonymous_namespace)::LocalPeerIdentityImpl,_std::nullptr_t> *)
             &stack0xffffffffffffffd8);
  Own<kj::(anonymous_namespace)::LocalPeerIdentityImpl,_std::nullptr_t>::~Own
            ((Own<kj::(anonymous_namespace)::LocalPeerIdentityImpl,_std::nullptr_t> *)
             &stack0xffffffffffffffd8);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

kj::Own<LocalPeerIdentity> LocalPeerIdentity::newInstance(LocalPeerIdentity::Credentials creds) {
  return kj::heap<LocalPeerIdentityImpl>(creds);
}